

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.c
# Opt level: O0

void MCRegisterInfo_InitMCRegisterInfo
               (MCRegisterInfo *RI,MCRegisterDesc *D,uint NR,uint RA,uint PC,MCRegisterClass *C,
               uint NC,uint16_t (*RURoots) [2],uint NRU,MCPhysReg *DL,char *Strings,
               uint16_t *SubIndices,uint NumIndices,uint16_t *RET)

{
  MCRegisterClass *C_local;
  uint PC_local;
  uint RA_local;
  uint NR_local;
  MCRegisterDesc *D_local;
  MCRegisterInfo *RI_local;
  
  RI->Desc = D;
  RI->NumRegs = NR;
  RI->RAReg = RA;
  RI->PCReg = PC;
  RI->Classes = C;
  RI->DiffLists = DL;
  RI->RegStrings = Strings;
  RI->NumClasses = NC;
  RI->RegUnitRoots = RURoots;
  RI->NumRegUnits = NRU;
  RI->SubRegIndices = SubIndices;
  RI->NumSubRegIndices = NumIndices;
  RI->RegEncodingTable = RET;
  return;
}

Assistant:

void MCRegisterInfo_InitMCRegisterInfo(MCRegisterInfo *RI,
		MCRegisterDesc *D, unsigned NR,
		unsigned RA, unsigned PC,
		MCRegisterClass *C, unsigned NC,
		uint16_t (*RURoots)[2], unsigned NRU,
		MCPhysReg *DL,
		char *Strings,
		uint16_t *SubIndices, unsigned NumIndices,
		uint16_t *RET)
{
	RI->Desc = D;
	RI->NumRegs = NR;
	RI->RAReg = RA;
	RI->PCReg = PC;
	RI->Classes = C;
	RI->DiffLists = DL;
	RI->RegStrings = Strings;
	RI->NumClasses = NC;
	RI->RegUnitRoots = RURoots;
	RI->NumRegUnits = NRU;
	RI->SubRegIndices = SubIndices;
	RI->NumSubRegIndices = NumIndices;
	RI->RegEncodingTable = RET;
}